

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::ExtensionSet::FindExtensionInfoFromFieldNumber
          (ExtensionSet *this,int wire_type,int field_number,ExtensionFinder *extension_finder,
          ExtensionInfo *extension,bool *was_packed_on_wire)

{
  bool bVar1;
  FieldType type;
  WireType WVar2;
  ulong uVar3;
  long *in_RCX;
  undefined4 in_EDX;
  WireType in_ESI;
  long in_R8;
  undefined1 *in_R9;
  WireType expected_wire_type;
  bool local_1;
  
  uVar3 = (**(code **)(*in_RCX + 0x10))(in_RCX,in_EDX,in_R8);
  if ((uVar3 & 1) == 0) {
    local_1 = false;
  }
  else {
    type = anon_unknown_19::real_type(wire_type._3_1_);
    WVar2 = WireFormatLite::WireTypeForFieldType(type);
    *in_R9 = 0;
    if ((((*(byte *)(in_R8 + 1) & 1) == 0) || (in_ESI != WIRETYPE_LENGTH_DELIMITED)) ||
       (bVar1 = anon_unknown_19::is_packable(field_number), !bVar1)) {
      local_1 = WVar2 == in_ESI;
    }
    else {
      *in_R9 = 1;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool ExtensionSet::FindExtensionInfoFromFieldNumber(
    int wire_type, int field_number, ExtensionFinder* extension_finder,
    ExtensionInfo* extension, bool* was_packed_on_wire) {
  if (!extension_finder->Find(field_number, extension)) {
    return false;
  }

  WireFormatLite::WireType expected_wire_type =
      WireFormatLite::WireTypeForFieldType(real_type(extension->type));

  // Check if this is a packed field.
  *was_packed_on_wire = false;
  if (extension->is_repeated &&
      wire_type == WireFormatLite::WIRETYPE_LENGTH_DELIMITED &&
      is_packable(expected_wire_type)) {
    *was_packed_on_wire = true;
    return true;
  }
  // Otherwise the wire type must match.
  return expected_wire_type == wire_type;
}